

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_helper.c
# Opt level: O1

void helper_v7m_preserve_fp_state_arm(CPUARMState *env)

{
  ARMCPU *cpu;
  ARMMMUIdx AVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  _Bool _Var4;
  uint32_t uVar5;
  uint32_t *puVar6;
  ARMMMUIdx mmu_idx;
  uint uVar7;
  ARMMMUIdx AVar8;
  uint uVar10;
  uint32_t addr;
  ulong uVar9;
  
  AVar1 = (env->v7m).fpccr[1];
  AVar8 = AVar1 & 4;
  uVar9 = (ulong)AVar8;
  uVar7 = *(uint *)((long)(env->v7m).fpccr + uVar9);
  switch(*(uint *)((long)(env->v7m).cpacr + uVar9) >> 0x14 & 3) {
  case 1:
    if ((uVar7 & 2) == 0) goto switchD_0059705e_caseD_3;
  default:
    puVar6 = (env->v7m).cfsr + (AVar8 >> 2);
    break;
  case 3:
switchD_0059705e_caseD_3:
    _Var4 = true;
    if ((AVar8 != 0) || (((env->v7m).nsacr & 0x400) != 0)) goto LAB_00597090;
    puVar6 = (env->v7m).cfsr + 1;
  }
  *(byte *)((long)puVar6 + 2) = *(byte *)((long)puVar6 + 2) | 8;
  _Var4 = false;
LAB_00597090:
  if (_Var4 == true && (uVar7 >> 9 & 1) == 0) {
    cpu = (ARMCPU *)(env[-10].cp15.c14_pmevcntr + 0x1b);
    uVar2 = *(uint32_t *)((long)(env->v7m).fpcar + uVar9);
    mmu_idx = (AVar1 >> 3 & 2 | (uint)((uVar7 & 2) == 0) | AVar8 | ARMMMUIdx_MUser) ^ 2;
    uVar7 = 0;
    uVar10 = 0;
    uVar5 = uVar2;
    do {
      addr = uVar5;
      if (0xf < uVar10) {
        addr = uVar5 + 8;
      }
      if (_Var4 == false) {
        _Var4 = false;
      }
      else {
        uVar3 = (env->vfp).zregs[uVar10 >> 2].d[uVar7 & 1];
        _Var4 = v7m_stack_write(cpu,addr,(uint32_t)uVar3,mmu_idx,STACK_LAZYFP);
        if (_Var4) {
          _Var4 = v7m_stack_write(cpu,addr + 4,(uint32_t)(uVar3 >> 0x20),mmu_idx,STACK_LAZYFP);
        }
        else {
          _Var4 = false;
        }
      }
      uVar10 = uVar10 + 2;
      uVar7 = uVar7 + 1;
      uVar5 = uVar5 + 8;
    } while (uVar10 < (uint)((AVar1 & 0x4000004) == 0x4000004) * 0x10 + 0x10);
    if (_Var4 != false) {
      uVar5 = vfp_get_fpscr_arm(env);
      v7m_stack_write(cpu,uVar2 + 0x40,uVar5,mmu_idx,STACK_LAZYFP);
    }
  }
  puVar6 = (env->v7m).fpccr + (AVar8 >> 2);
  *(byte *)puVar6 = (byte)*puVar6 & 0xfe;
  if ((AVar1 & 0x4000004) != 0x4000004) {
    return;
  }
  uVar7 = 0xfffffffe;
  uVar10 = 0;
  do {
    uVar7 = uVar7 + 2;
    (env->vfp).zregs[uVar7 >> 2].d[uVar10 & 1] = 0;
    uVar10 = uVar10 + 1;
  } while (uVar7 < 0x1e);
  vfp_set_fpscr_arm(env,0);
  return;
}

Assistant:

void HELPER(v7m_preserve_fp_state)(CPUARMState *env)
{
    /*
     * Preserve FP state (because LSPACT was set and we are about
     * to execute an FP instruction). This corresponds to the
     * PreserveFPState() pseudocode.
     * We may throw an exception if the stacking fails.
     */
    ARMCPU *cpu = env_archcpu(env);
    bool is_secure = env->v7m.fpccr[M_REG_S] & R_V7M_FPCCR_S_MASK;
    bool negpri = !(env->v7m.fpccr[M_REG_S] & R_V7M_FPCCR_HFRDY_MASK);
    bool is_priv = !(env->v7m.fpccr[is_secure] & R_V7M_FPCCR_USER_MASK);
    bool splimviol = env->v7m.fpccr[is_secure] & R_V7M_FPCCR_SPLIMVIOL_MASK;
    uint32_t fpcar = env->v7m.fpcar[is_secure];
    bool stacked_ok = true;
    bool ts = is_secure && (env->v7m.fpccr[M_REG_S] & R_V7M_FPCCR_TS_MASK);
    bool take_exception;

    /* Check the background context had access to the FPU */
    if (!v7m_cpacr_pass(env, is_secure, is_priv)) {
        // armv7m_nvic_set_pending_lazyfp(env->nvic, ARMV7M_EXCP_USAGE, is_secure);
        env->v7m.cfsr[is_secure] |= R_V7M_CFSR_NOCP_MASK;
        stacked_ok = false;
    } else if (!is_secure && !extract32(env->v7m.nsacr, 10, 1)) {
        // armv7m_nvic_set_pending_lazyfp(env->nvic, ARMV7M_EXCP_USAGE, M_REG_S);
        env->v7m.cfsr[M_REG_S] |= R_V7M_CFSR_NOCP_MASK;
        stacked_ok = false;
    }

    if (!splimviol && stacked_ok) {
        /* We only stack if the stack limit wasn't violated */
        int i;
        ARMMMUIdx mmu_idx;

        mmu_idx = arm_v7m_mmu_idx_all(env, is_secure, is_priv, negpri);
        for (i = 0; i < (ts ? 32 : 16); i += 2) {
            uint64_t dn = *aa32_vfp_dreg(env, i / 2);
            uint32_t faddr = fpcar + 4 * i;
            uint32_t slo = extract64(dn, 0, 32);
            uint32_t shi = extract64(dn, 32, 32);

            if (i >= 16) {
                faddr += 8; /* skip the slot for the FPSCR */
            }
            stacked_ok = stacked_ok &&
                v7m_stack_write(cpu, faddr, slo, mmu_idx, STACK_LAZYFP) &&
                v7m_stack_write(cpu, faddr + 4, shi, mmu_idx, STACK_LAZYFP);
        }

        stacked_ok = stacked_ok &&
            v7m_stack_write(cpu, fpcar + 0x40,
                            vfp_get_fpscr(env), mmu_idx, STACK_LAZYFP);
    }

    /*
     * We definitely pended an exception, but it's possible that it
     * might not be able to be taken now. If its priority permits us
     * to take it now, then we must not update the LSPACT or FP regs,
     * but instead jump out to take the exception immediately.
     * If it's just pending and won't be taken until the current
     * handler exits, then we do update LSPACT and the FP regs.
     */
    // take_exception = !stacked_ok &&
    //     armv7m_nvic_can_take_pending_exception(env->nvic);
    /* consider armv7m_nvic_can_take_pending_exception() always return false.
        in unicorn */
    take_exception = false;

    if (take_exception) {
        raise_exception_ra(env, EXCP_LAZYFP, 0, 1, GETPC());
    }

    env->v7m.fpccr[is_secure] &= ~R_V7M_FPCCR_LSPACT_MASK;

    if (ts) {
        /* Clear s0 to s31 and the FPSCR */
        int i;

        for (i = 0; i < 32; i += 2) {
            *aa32_vfp_dreg(env, i / 2) = 0;
        }
        vfp_set_fpscr(env, 0);
    }
    /*
     * Otherwise s0 to s15 and FPSCR are UNKNOWN; we choose to leave them
     * unchanged.
     */
}